

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  uint *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  int iVar16;
  float **ppfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  Geometry *pGVar21;
  RTCFilterFunctionN p_Var22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  uint uVar38;
  NodeRef *pNVar39;
  float *pfVar40;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  Scene *pSVar44;
  NodeRef *pNVar45;
  uint *puVar46;
  int iVar47;
  size_t sVar48;
  ulong uVar49;
  float fVar50;
  float fVar63;
  float fVar64;
  undefined1 auVar51 [16];
  float fVar65;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar66;
  float fVar81;
  float fVar82;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar83;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar95;
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar103;
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar109;
  float fVar110;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar124;
  float fVar128;
  float fVar132;
  undefined1 auVar122 [16];
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar133;
  float fVar134;
  undefined1 auVar123 [16];
  float fVar135;
  float fVar136;
  float fVar139;
  float fVar141;
  float fVar143;
  undefined1 auVar137 [16];
  float fVar140;
  float fVar142;
  float fVar144;
  undefined1 auVar138 [16];
  float fVar145;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar146 [16];
  float fVar152;
  float fVar153;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  NodeRef *local_cb0;
  float fStack_ca4;
  float local_c88;
  float fStack_c84;
  float fStack_c80;
  float fStack_c7c;
  float local_c58;
  float fStack_c54;
  float fStack_c50;
  float fStack_c4c;
  undefined1 local_c48 [16];
  Scene *scene;
  float local_c28;
  float fStack_c24;
  float fStack_c20;
  float fStack_c1c;
  undefined8 local_c18;
  undefined8 uStack_c10;
  long local_c08;
  undefined1 (*local_c00) [16];
  RTCFilterFunctionNArguments args;
  float local_b48;
  float fStack_b44;
  float fStack_b40;
  float fStack_b3c;
  float local_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float local_b28;
  float fStack_b24;
  float fStack_b20;
  float fStack_b1c;
  float local_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float fStack_afc;
  float fStack_aec;
  undefined1 local_a78 [16];
  undefined1 local_a68 [16];
  undefined1 local_a58 [8];
  float fStack_a50;
  float fStack_a4c;
  undefined1 local_a48 [16];
  undefined1 local_a38 [16];
  undefined1 local_a28 [16];
  undefined1 local_a18 [16];
  RTCHitN local_a08 [16];
  undefined1 local_9f8 [16];
  undefined4 local_9e8;
  undefined4 uStack_9e4;
  undefined4 uStack_9e0;
  undefined4 uStack_9dc;
  undefined4 local_9d8;
  undefined4 uStack_9d4;
  undefined4 uStack_9d0;
  undefined4 uStack_9cc;
  undefined1 local_9c8 [16];
  undefined4 local_9b8;
  undefined4 uStack_9b4;
  undefined4 uStack_9b0;
  undefined4 uStack_9ac;
  uint local_9a8;
  uint uStack_9a4;
  uint uStack_9a0;
  uint uStack_99c;
  uint local_998;
  uint uStack_994;
  uint uStack_990;
  uint uStack_98c;
  uint local_988;
  uint uStack_984;
  uint uStack_980;
  uint uStack_97c;
  undefined1 local_978 [16];
  undefined1 local_968 [16];
  float local_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  float local_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  float local_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  undefined8 local_8a8;
  float fStack_8a0;
  float fStack_89c;
  undefined8 local_898;
  float fStack_890;
  float fStack_88c;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  float fStack_860;
  float fStack_85c;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  undefined1 local_7e8 [16];
  NodeRef stack [244];
  
  uVar37 = mm_lookupmask_ps._252_4_;
  uVar36 = mm_lookupmask_ps._248_4_;
  uVar35 = mm_lookupmask_ps._244_4_;
  uVar34 = mm_lookupmask_ps._240_4_;
  stack[0] = root;
  local_8d8 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_8e8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_8f8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_908 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_918 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_928 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_948 = local_908 * 0.99999964;
  local_958 = local_918 * 0.99999964;
  local_938 = local_928 * 0.99999964;
  local_908 = local_908 * 1.0000004;
  local_918 = local_918 * 1.0000004;
  local_928 = local_928 * 1.0000004;
  iVar16 = *(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar42 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar49 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar47 = (tray->tnear).field_0.i[k];
  local_968._4_4_ = iVar47;
  local_968._0_4_ = iVar47;
  local_968._8_4_ = iVar47;
  local_968._12_4_ = iVar47;
  iVar47 = (tray->tfar).field_0.i[k];
  local_978._4_4_ = iVar47;
  local_978._0_4_ = iVar47;
  local_978._8_4_ = iVar47;
  local_978._12_4_ = iVar47;
  local_7e8 = mm_lookupmask_ps._0_16_;
  local_c00 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_cb0 = stack + 1;
  fStack_904 = local_908;
  fStack_900 = local_908;
  fStack_8fc = local_908;
  fStack_914 = local_918;
  fStack_910 = local_918;
  fStack_90c = local_918;
  fStack_934 = local_938;
  fStack_930 = local_938;
  fStack_92c = local_938;
  fStack_944 = local_948;
  fStack_940 = local_948;
  fStack_93c = local_948;
  fStack_8d4 = local_8d8;
  fStack_8d0 = local_8d8;
  fStack_8cc = local_8d8;
  fStack_8e4 = local_8e8;
  fStack_8e0 = local_8e8;
  fStack_8dc = local_8e8;
  fStack_8f4 = local_8f8;
  fStack_8f0 = local_8f8;
  fStack_8ec = local_8f8;
  fStack_924 = local_928;
  fStack_920 = local_928;
  fStack_91c = local_928;
  fStack_954 = local_958;
  fStack_950 = local_958;
  fStack_94c = local_958;
LAB_00718dc3:
  do {
    pNVar45 = local_cb0;
    if (pNVar45 == stack) {
LAB_0071a2ef:
      return pNVar45 != stack;
    }
    pNVar39 = pNVar45 + -1;
    sVar48 = pNVar45[-1].ptr;
    local_cb0 = pNVar39;
    while ((sVar48 & 8) == 0) {
      pfVar13 = (float *)(sVar48 + 0x20 + (long)iVar16);
      auVar51._0_4_ = (*pfVar13 - local_8d8) * local_948;
      auVar51._4_4_ = (pfVar13[1] - fStack_8d4) * fStack_944;
      auVar51._8_4_ = (pfVar13[2] - fStack_8d0) * fStack_940;
      auVar51._12_4_ = (pfVar13[3] - fStack_8cc) * fStack_93c;
      pfVar13 = (float *)(sVar48 + 0x20 + uVar42);
      auVar86._0_4_ = (*pfVar13 - local_8e8) * local_958;
      auVar86._4_4_ = (pfVar13[1] - fStack_8e4) * fStack_954;
      auVar86._8_4_ = (pfVar13[2] - fStack_8e0) * fStack_950;
      auVar86._12_4_ = (pfVar13[3] - fStack_8dc) * fStack_94c;
      auVar51 = maxps(auVar51,auVar86);
      pfVar13 = (float *)(sVar48 + 0x20 + uVar49);
      auVar67._0_4_ = (*pfVar13 - local_8f8) * local_938;
      auVar67._4_4_ = (pfVar13[1] - fStack_8f4) * fStack_934;
      auVar67._8_4_ = (pfVar13[2] - fStack_8f0) * fStack_930;
      auVar67._12_4_ = (pfVar13[3] - fStack_8ec) * fStack_92c;
      auVar68 = maxps(auVar67,local_968);
      auVar51 = maxps(auVar51,auVar68);
      pfVar13 = (float *)(sVar48 + 0x20 + ((long)iVar16 ^ 0x10U));
      auVar69._0_4_ = (*pfVar13 - local_8d8) * local_908;
      auVar69._4_4_ = (pfVar13[1] - fStack_8d4) * fStack_904;
      auVar69._8_4_ = (pfVar13[2] - fStack_8d0) * fStack_900;
      auVar69._12_4_ = (pfVar13[3] - fStack_8cc) * fStack_8fc;
      pfVar13 = (float *)(sVar48 + 0x20 + (uVar42 ^ 0x10));
      auVar84._0_4_ = (*pfVar13 - local_8e8) * local_918;
      auVar84._4_4_ = (pfVar13[1] - fStack_8e4) * fStack_914;
      auVar84._8_4_ = (pfVar13[2] - fStack_8e0) * fStack_910;
      auVar84._12_4_ = (pfVar13[3] - fStack_8dc) * fStack_90c;
      auVar68 = minps(auVar69,auVar84);
      pfVar13 = (float *)(sVar48 + 0x20 + (uVar49 ^ 0x10));
      auVar85._0_4_ = (*pfVar13 - local_8f8) * local_928;
      auVar85._4_4_ = (pfVar13[1] - fStack_8f4) * fStack_924;
      auVar85._8_4_ = (pfVar13[2] - fStack_8f0) * fStack_920;
      auVar85._12_4_ = (pfVar13[3] - fStack_8ec) * fStack_91c;
      auVar86 = minps(auVar85,local_978);
      auVar86 = minps(auVar68,auVar86);
      auVar68._4_4_ = -(uint)(auVar51._4_4_ <= auVar86._4_4_);
      auVar68._0_4_ = -(uint)(auVar51._0_4_ <= auVar86._0_4_);
      auVar68._8_4_ = -(uint)(auVar51._8_4_ <= auVar86._8_4_);
      auVar68._12_4_ = -(uint)(auVar51._12_4_ <= auVar86._12_4_);
      uVar38 = movmskps((int)pNVar39,auVar68);
      if (uVar38 == 0) goto LAB_00718dc3;
      uVar38 = uVar38 & 0xff;
      pNVar39 = (NodeRef *)(sVar48 & 0xfffffffffffffff0);
      lVar41 = 0;
      if (uVar38 != 0) {
        for (; (uVar38 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
        }
      }
      sVar48 = pNVar39[lVar41].ptr;
      uVar38 = uVar38 - 1 & uVar38;
      uVar43 = (ulong)uVar38;
      if (uVar38 != 0) {
        do {
          local_cb0->ptr = sVar48;
          local_cb0 = local_cb0 + 1;
          lVar41 = 0;
          if (uVar43 != 0) {
            for (; (uVar43 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
            }
          }
          sVar48 = pNVar39[lVar41].ptr;
          uVar43 = uVar43 - 1 & uVar43;
        } while (uVar43 != 0);
      }
    }
    for (lVar41 = 0; lVar41 != (ulong)((uint)sVar48 & 0xf) - 8; lVar41 = lVar41 + 1) {
      pSVar44 = context->scene;
      puVar1 = (uint *)((sVar48 & 0xfffffffffffffff0) + lVar41 * 0x60);
      puVar46 = puVar1 + 0x10;
      ppfVar17 = (pSVar44->vertices).items;
      pfVar18 = ppfVar17[*puVar46];
      pfVar13 = pfVar18 + *puVar1;
      pfVar2 = pfVar18 + puVar1[4];
      pfVar3 = pfVar18 + puVar1[0xc];
      pfVar19 = ppfVar17[puVar1[0x11]];
      pfVar4 = pfVar19 + puVar1[1];
      pfVar5 = pfVar19 + puVar1[5];
      pfVar6 = pfVar19 + puVar1[0xd];
      pfVar40 = ppfVar17[puVar1[0x12]];
      pfVar7 = pfVar40 + puVar1[2];
      pfVar8 = pfVar40 + puVar1[6];
      pfVar9 = pfVar40 + puVar1[0xe];
      pfVar20 = ppfVar17[puVar1[0x13]];
      pfVar10 = pfVar20 + puVar1[3];
      pfVar11 = pfVar20 + puVar1[7];
      pfVar12 = pfVar20 + puVar1[0xf];
      fVar65 = *(float *)(ray + k * 4);
      fStack_aec = *(float *)(ray + k * 4 + 0x10);
      fStack_afc = *(float *)(ray + k * 4 + 0x20);
      fVar152 = *pfVar13 - fVar65;
      fVar156 = *pfVar4 - fVar65;
      fVar158 = *pfVar7 - fVar65;
      fVar160 = *pfVar10 - fVar65;
      fVar109 = pfVar13[1] - fStack_aec;
      fVar113 = pfVar4[1] - fStack_aec;
      fVar115 = pfVar7[1] - fStack_aec;
      fVar117 = pfVar10[1] - fStack_aec;
      fVar145 = pfVar13[2] - fStack_afc;
      fVar147 = pfVar4[2] - fStack_afc;
      fVar149 = pfVar7[2] - fStack_afc;
      fVar151 = pfVar10[2] - fStack_afc;
      fVar95 = *pfVar2 - fVar65;
      fVar100 = *pfVar5 - fVar65;
      fVar101 = *pfVar8 - fVar65;
      fVar102 = *pfVar11 - fVar65;
      local_868 = CONCAT44(*pfVar6,*pfVar3);
      local_858 = *pfVar9;
      fStack_854 = *pfVar12;
      fVar50 = *pfVar3 - fVar65;
      fVar63 = *pfVar6 - fVar65;
      fVar64 = *pfVar9 - fVar65;
      fVar65 = *pfVar12 - fVar65;
      local_8c8 = pfVar3[1];
      fStack_8c4 = pfVar6[1];
      fStack_8c0 = pfVar9[1];
      fStack_8bc = pfVar12[1];
      local_c58 = pfVar3[1] - fStack_aec;
      fStack_c54 = pfVar6[1] - fStack_aec;
      fStack_c50 = pfVar9[1] - fStack_aec;
      fStack_c4c = pfVar12[1] - fStack_aec;
      local_8a8 = CONCAT44(pfVar6[2],pfVar3[2]);
      local_c88 = pfVar3[2] - fStack_afc;
      fStack_c84 = pfVar6[2] - fStack_afc;
      fStack_c80 = pfVar9[2] - fStack_afc;
      fStack_c7c = pfVar12[2] - fStack_afc;
      fVar66 = fVar50 - fVar152;
      fVar81 = fVar63 - fVar156;
      fVar82 = fVar64 - fVar158;
      fVar83 = fVar65 - fVar160;
      local_7f8 = local_c58 - fVar109;
      fStack_7f4 = fStack_c54 - fVar113;
      fStack_7f0 = fStack_c50 - fVar115;
      fStack_7ec = fStack_c4c - fVar117;
      fVar103 = local_c88 - fVar145;
      fVar106 = fStack_c84 - fVar147;
      fVar107 = fStack_c80 - fVar149;
      fVar108 = fStack_c7c - fVar151;
      fVar148 = *(float *)(ray + k * 4 + 0x50);
      fStack_ca4 = *(float *)(ray + k * 4 + 0x60);
      fVar150 = *(float *)(ray + k * 4 + 0x40);
      local_838 = (local_7f8 * (local_c88 + fVar145) - (local_c58 + fVar109) * fVar103) * fVar150 +
                  ((fVar50 + fVar152) * fVar103 - (local_c88 + fVar145) * fVar66) * fVar148 +
                  (fVar66 * (local_c58 + fVar109) - (fVar50 + fVar152) * local_7f8) * fStack_ca4;
      fStack_834 = (fStack_7f4 * (fStack_c84 + fVar147) - (fStack_c54 + fVar113) * fVar106) *
                   fVar150 + ((fVar63 + fVar156) * fVar106 - (fStack_c84 + fVar147) * fVar81) *
                             fVar148 + (fVar81 * (fStack_c54 + fVar113) -
                                       (fVar63 + fVar156) * fStack_7f4) * fStack_ca4;
      fStack_830 = (fStack_7f0 * (fStack_c80 + fVar149) - (fStack_c50 + fVar115) * fVar107) *
                   fVar150 + ((fVar64 + fVar158) * fVar107 - (fStack_c80 + fVar149) * fVar82) *
                             fVar148 + (fVar82 * (fStack_c50 + fVar115) -
                                       (fVar64 + fVar158) * fStack_7f0) * fStack_ca4;
      fStack_82c = (fStack_7ec * (fStack_c7c + fVar151) - (fStack_c4c + fVar117) * fVar108) *
                   fVar150 + ((fVar65 + fVar160) * fVar108 - (fStack_c7c + fVar151) * fVar83) *
                             fVar148 + (fVar83 * (fStack_c4c + fVar117) -
                                       (fVar65 + fVar160) * fStack_7ec) * fStack_ca4;
      local_8b8 = pfVar2[1];
      fStack_8b4 = pfVar5[1];
      fStack_8b0 = pfVar8[1];
      fStack_8ac = pfVar11[1];
      local_b48 = pfVar2[1] - fStack_aec;
      fStack_b44 = pfVar5[1] - fStack_aec;
      fStack_b40 = pfVar8[1] - fStack_aec;
      fStack_b3c = pfVar11[1] - fStack_aec;
      local_898 = CONCAT44(pfVar5[2],pfVar2[2]);
      local_b38 = pfVar2[2] - fStack_afc;
      fStack_b34 = pfVar5[2] - fStack_afc;
      fStack_b30 = pfVar8[2] - fStack_afc;
      fStack_b2c = pfVar11[2] - fStack_afc;
      fVar135 = fVar152 - fVar95;
      fVar139 = fVar156 - fVar100;
      fVar141 = fVar158 - fVar101;
      fVar143 = fVar160 - fVar102;
      fVar119 = fVar109 - local_b48;
      fVar124 = fVar113 - fStack_b44;
      fVar128 = fVar115 - fStack_b40;
      fVar132 = fVar117 - fStack_b3c;
      local_808 = fVar145 - local_b38;
      fStack_804 = fVar147 - fStack_b34;
      fStack_800 = fVar149 - fStack_b30;
      fStack_7fc = fVar151 - fStack_b2c;
      local_848 = (fVar119 * (fVar145 + local_b38) - (fVar109 + local_b48) * local_808) * fVar150 +
                  ((fVar152 + fVar95) * local_808 - (fVar145 + local_b38) * fVar135) * fVar148 +
                  (fVar135 * (fVar109 + local_b48) - (fVar152 + fVar95) * fVar119) * fStack_ca4;
      fStack_844 = (fVar124 * (fVar147 + fStack_b34) - (fVar113 + fStack_b44) * fStack_804) *
                   fVar150 + ((fVar156 + fVar100) * fStack_804 - (fVar147 + fStack_b34) * fVar139) *
                             fVar148 + (fVar139 * (fVar113 + fStack_b44) -
                                       (fVar156 + fVar100) * fVar124) * fStack_ca4;
      fStack_840 = (fVar128 * (fVar149 + fStack_b30) - (fVar115 + fStack_b40) * fStack_800) *
                   fVar150 + ((fVar158 + fVar101) * fStack_800 - (fVar149 + fStack_b30) * fVar141) *
                             fVar148 + (fVar141 * (fVar115 + fStack_b40) -
                                       (fVar158 + fVar101) * fVar128) * fStack_ca4;
      fStack_83c = (fVar132 * (fVar151 + fStack_b2c) - (fVar117 + fStack_b3c) * fStack_7fc) *
                   fVar150 + ((fVar160 + fVar102) * fStack_7fc - (fVar151 + fStack_b2c) * fVar143) *
                             fVar148 + (fVar143 * (fVar117 + fStack_b3c) -
                                       (fVar160 + fVar102) * fVar132) * fStack_ca4;
      fVar153 = fVar95 - fVar50;
      fVar157 = fVar100 - fVar63;
      fVar159 = fVar101 - fVar64;
      fVar161 = fVar102 - fVar65;
      fVar110 = local_b48 - local_c58;
      fVar114 = fStack_b44 - fStack_c54;
      fVar116 = fStack_b40 - fStack_c50;
      fVar118 = fStack_b3c - fStack_c4c;
      local_818 = local_b38 - local_c88;
      fStack_814 = fStack_b34 - fStack_c84;
      fStack_810 = fStack_b30 - fStack_c80;
      fStack_80c = fStack_b2c - fStack_c7c;
      local_b28 = local_b48 + local_c58;
      fStack_b24 = fStack_b44 + fStack_c54;
      fStack_b20 = fStack_b40 + fStack_c50;
      fStack_b1c = fStack_b3c + fStack_c4c;
      local_b18 = local_b38 + local_c88;
      fStack_b14 = fStack_b34 + fStack_c84;
      fStack_b10 = fStack_b30 + fStack_c80;
      fStack_b0c = fStack_b2c + fStack_c7c;
      auVar70._0_4_ =
           (fVar110 * local_b18 - local_b28 * local_818) * fVar150 +
           ((fVar50 + fVar95) * local_818 - fVar153 * local_b18) * fVar148 +
           (fVar153 * local_b28 - (fVar50 + fVar95) * fVar110) * fStack_ca4;
      auVar70._4_4_ =
           (fVar114 * fStack_b14 - fStack_b24 * fStack_814) * fVar150 +
           ((fVar63 + fVar100) * fStack_814 - fVar157 * fStack_b14) * fVar148 +
           (fVar157 * fStack_b24 - (fVar63 + fVar100) * fVar114) * fStack_ca4;
      auVar70._8_4_ =
           (fVar116 * fStack_b10 - fStack_b20 * fStack_810) * fVar150 +
           ((fVar64 + fVar101) * fStack_810 - fVar159 * fStack_b10) * fVar148 +
           (fVar159 * fStack_b20 - (fVar64 + fVar101) * fVar116) * fStack_ca4;
      auVar70._12_4_ =
           (fVar118 * fStack_b0c - fStack_b1c * fStack_80c) * fVar150 +
           ((fVar65 + fVar102) * fStack_80c - fVar161 * fStack_b0c) * fVar148 +
           (fVar161 * fStack_b1c - (fVar65 + fVar102) * fVar118) * fStack_ca4;
      fVar95 = local_838 + local_848 + auVar70._0_4_;
      fVar100 = fStack_834 + fStack_844 + auVar70._4_4_;
      fVar101 = fStack_830 + fStack_840 + auVar70._8_4_;
      fVar102 = fStack_82c + fStack_83c + auVar70._12_4_;
      auVar52._4_4_ = fStack_834;
      auVar52._0_4_ = local_838;
      auVar52._8_4_ = fStack_830;
      auVar52._12_4_ = fStack_82c;
      auVar25._4_4_ = fStack_844;
      auVar25._0_4_ = local_848;
      auVar25._8_4_ = fStack_840;
      auVar25._12_4_ = fStack_83c;
      auVar51 = minps(auVar52,auVar25);
      auVar51 = minps(auVar51,auVar70);
      auVar96._4_4_ = fStack_834;
      auVar96._0_4_ = local_838;
      auVar96._8_4_ = fStack_830;
      auVar96._12_4_ = fStack_82c;
      auVar26._4_4_ = fStack_844;
      auVar26._0_4_ = local_848;
      auVar26._8_4_ = fStack_840;
      auVar26._12_4_ = fStack_83c;
      auVar68 = maxps(auVar96,auVar26);
      auVar68 = maxps(auVar68,auVar70);
      fVar65 = ABS(fVar95) * 1.1920929e-07;
      fVar50 = ABS(fVar100) * 1.1920929e-07;
      fVar63 = ABS(fVar101) * 1.1920929e-07;
      fVar64 = ABS(fVar102) * 1.1920929e-07;
      auVar97._4_4_ = -(uint)(auVar68._4_4_ <= fVar50);
      auVar97._0_4_ = -(uint)(auVar68._0_4_ <= fVar65);
      auVar97._8_4_ = -(uint)(auVar68._8_4_ <= fVar63);
      auVar97._12_4_ = -(uint)(auVar68._12_4_ <= fVar64);
      auVar53._4_4_ = -(uint)(-fVar50 <= auVar51._4_4_);
      auVar53._0_4_ = -(uint)(-fVar65 <= auVar51._0_4_);
      auVar53._8_4_ = -(uint)(-fVar63 <= auVar51._8_4_);
      auVar53._12_4_ = -(uint)(-fVar64 <= auVar51._12_4_);
      auVar97 = auVar97 | auVar53;
      local_c08 = (sVar48 & 0xfffffffffffffff0) + lVar41 * 0x60;
      iVar47 = movmskps(iVar16,auVar97);
      auVar51 = *(undefined1 (*) [16])(pfVar18 + puVar1[8]);
      local_878 = *(undefined8 *)(pfVar19 + puVar1[9]);
      uStack_870 = *(undefined8 *)(pfVar19 + puVar1[9] + 2);
      local_888 = *(undefined8 *)(pfVar40 + puVar1[10]);
      uStack_880 = *(undefined8 *)(pfVar40 + puVar1[10] + 2);
      local_c18 = *(undefined8 *)(pfVar20 + puVar1[0xb]);
      uStack_c10 = *(undefined8 *)(pfVar20 + puVar1[0xb] + 2);
      scene = pSVar44;
      if (iVar47 != 0) {
        local_828 = fVar110;
        fStack_824 = fVar114;
        fStack_820 = fVar116;
        fStack_81c = fVar118;
        auVar122._0_4_ = fVar119 * local_818 - fVar110 * local_808;
        auVar122._4_4_ = fVar124 * fStack_814 - fVar114 * fStack_804;
        auVar122._8_4_ = fVar128 * fStack_810 - fVar116 * fStack_800;
        auVar122._12_4_ = fVar132 * fStack_80c - fVar118 * fStack_7fc;
        auVar54._4_4_ = -(uint)(ABS(fVar124 * fVar106) < ABS(fVar114 * fStack_804));
        auVar54._0_4_ = -(uint)(ABS(fVar119 * fVar103) < ABS(fVar110 * local_808));
        auVar54._8_4_ = -(uint)(ABS(fVar128 * fVar107) < ABS(fVar116 * fStack_800));
        auVar54._12_4_ = -(uint)(ABS(fVar132 * fVar108) < ABS(fVar118 * fStack_7fc));
        auVar27._4_4_ = fStack_7f4 * fStack_804 - fVar124 * fVar106;
        auVar27._0_4_ = local_7f8 * local_808 - fVar119 * fVar103;
        auVar27._8_4_ = fStack_7f0 * fStack_800 - fVar128 * fVar107;
        auVar27._12_4_ = fStack_7ec * fStack_7fc - fVar132 * fVar108;
        local_a48 = blendvps(auVar122,auVar27,auVar54);
        auVar154._0_4_ = fVar153 * local_808 - fVar135 * local_818;
        auVar154._4_4_ = fVar157 * fStack_804 - fVar139 * fStack_814;
        auVar154._8_4_ = fVar159 * fStack_800 - fVar141 * fStack_810;
        auVar154._12_4_ = fVar161 * fStack_7fc - fVar143 * fStack_80c;
        auVar55._4_4_ = -(uint)(ABS(fVar81 * fStack_804) < ABS(fVar139 * fStack_814));
        auVar55._0_4_ = -(uint)(ABS(fVar66 * local_808) < ABS(fVar135 * local_818));
        auVar55._8_4_ = -(uint)(ABS(fVar82 * fStack_800) < ABS(fVar141 * fStack_810));
        auVar55._12_4_ = -(uint)(ABS(fVar83 * fStack_7fc) < ABS(fVar143 * fStack_80c));
        auVar24._4_4_ = fVar106 * fVar139 - fVar81 * fStack_804;
        auVar24._0_4_ = fVar103 * fVar135 - fVar66 * local_808;
        auVar24._8_4_ = fVar107 * fVar141 - fVar82 * fStack_800;
        auVar24._12_4_ = fVar108 * fVar143 - fVar83 * fStack_7fc;
        local_a38 = blendvps(auVar154,auVar24,auVar55);
        auVar104._0_4_ = fVar66 * fVar119 - fVar135 * local_7f8;
        auVar104._4_4_ = fVar81 * fVar124 - fVar139 * fStack_7f4;
        auVar104._8_4_ = fVar82 * fVar128 - fVar141 * fStack_7f0;
        auVar104._12_4_ = fVar83 * fVar132 - fVar143 * fStack_7ec;
        auVar137._0_4_ = fVar135 * fVar110 - fVar153 * fVar119;
        auVar137._4_4_ = fVar139 * fVar114 - fVar157 * fVar124;
        auVar137._8_4_ = fVar141 * fVar116 - fVar159 * fVar128;
        auVar137._12_4_ = fVar143 * fVar118 - fVar161 * fVar132;
        auVar56._4_4_ = -(uint)(ABS(fVar139 * fStack_7f4) < ABS(fVar157 * fVar124));
        auVar56._0_4_ = -(uint)(ABS(fVar135 * local_7f8) < ABS(fVar153 * fVar119));
        auVar56._8_4_ = -(uint)(ABS(fVar141 * fStack_7f0) < ABS(fVar159 * fVar128));
        auVar56._12_4_ = -(uint)(ABS(fVar143 * fStack_7ec) < ABS(fVar161 * fVar132));
        local_a28 = blendvps(auVar137,auVar104,auVar56);
        fVar65 = fVar150 * local_a48._0_4_ +
                 fVar148 * local_a38._0_4_ + fStack_ca4 * local_a28._0_4_;
        fVar50 = fVar150 * local_a48._4_4_ +
                 fVar148 * local_a38._4_4_ + fStack_ca4 * local_a28._4_4_;
        fVar63 = fVar150 * local_a48._8_4_ +
                 fVar148 * local_a38._8_4_ + fStack_ca4 * local_a28._8_4_;
        fVar64 = fVar150 * local_a48._12_4_ +
                 fVar148 * local_a38._12_4_ + fStack_ca4 * local_a28._12_4_;
        auVar71._0_4_ = fVar65 + fVar65;
        auVar71._4_4_ = fVar50 + fVar50;
        auVar71._8_4_ = fVar63 + fVar63;
        auVar71._12_4_ = fVar64 + fVar64;
        auVar87._0_4_ = fVar109 * local_a38._0_4_ + fVar145 * local_a28._0_4_;
        auVar87._4_4_ = fVar113 * local_a38._4_4_ + fVar147 * local_a28._4_4_;
        auVar87._8_4_ = fVar115 * local_a38._8_4_ + fVar149 * local_a28._8_4_;
        auVar87._12_4_ = fVar117 * local_a38._12_4_ + fVar151 * local_a28._12_4_;
        fVar103 = fVar152 * local_a48._0_4_ + auVar87._0_4_;
        fVar106 = fVar156 * local_a48._4_4_ + auVar87._4_4_;
        fVar107 = fVar158 * local_a48._8_4_ + auVar87._8_4_;
        fVar108 = fVar160 * local_a48._12_4_ + auVar87._12_4_;
        auVar68 = rcpps(auVar87,auVar71);
        fVar65 = auVar68._0_4_;
        fVar63 = auVar68._4_4_;
        fVar64 = auVar68._8_4_;
        fVar66 = auVar68._12_4_;
        fVar81 = (float)DAT_01f46a60;
        fVar82 = DAT_01f46a60._4_4_;
        fVar83 = DAT_01f46a60._12_4_;
        fVar50 = DAT_01f46a60._8_4_;
        local_a58._0_4_ =
             ((fVar81 - auVar71._0_4_ * fVar65) * fVar65 + fVar65) * (fVar103 + fVar103);
        local_a58._4_4_ =
             ((fVar82 - auVar71._4_4_ * fVar63) * fVar63 + fVar63) * (fVar106 + fVar106);
        fStack_a50 = ((fVar50 - auVar71._8_4_ * fVar64) * fVar64 + fVar64) * (fVar107 + fVar107);
        fStack_a4c = ((fVar83 - auVar71._12_4_ * fVar66) * fVar66 + fVar66) * (fVar108 + fVar108);
        local_c28 = *(float *)(ray + k * 4 + 0x80);
        fStack_c24 = 0.0;
        fStack_c20 = 0.0;
        fStack_c1c = 0.0;
        fVar65 = *(float *)(ray + k * 4 + 0x30);
        auVar88._0_4_ =
             -(uint)((float)local_a58._0_4_ <= local_c28 && fVar65 <= (float)local_a58._0_4_) &
             auVar97._0_4_;
        auVar88._4_4_ =
             -(uint)((float)local_a58._4_4_ <= local_c28 && fVar65 <= (float)local_a58._4_4_) &
             auVar97._4_4_;
        auVar88._8_4_ = -(uint)(fStack_a50 <= local_c28 && fVar65 <= fStack_a50) & auVar97._8_4_;
        auVar88._12_4_ = -(uint)(fStack_a4c <= local_c28 && fVar65 <= fStack_a4c) & auVar97._12_4_;
        uVar38 = movmskps((int)pfVar40,auVar88);
        pfVar40 = (float *)(ulong)uVar38;
        if (uVar38 != 0) {
          auVar89._0_4_ = auVar88._0_4_ & -(uint)(auVar71._0_4_ != 0.0);
          auVar89._4_4_ = auVar88._4_4_ & -(uint)(auVar71._4_4_ != 0.0);
          auVar89._8_4_ = auVar88._8_4_ & -(uint)(auVar71._8_4_ != 0.0);
          auVar89._12_4_ = auVar88._12_4_ & -(uint)(auVar71._12_4_ != 0.0);
          uVar38 = movmskps(uVar38,auVar89);
          pfVar40 = (float *)(ulong)uVar38;
          if (uVar38 != 0) {
            auVar32._4_4_ = fVar100;
            auVar32._0_4_ = fVar95;
            auVar32._8_4_ = fVar101;
            auVar32._12_4_ = fVar102;
            local_a18 = local_7e8;
            auVar68 = rcpps(auVar89,auVar32);
            fVar65 = auVar68._0_4_;
            fVar148 = auVar68._4_4_;
            fVar150 = auVar68._8_4_;
            fVar63 = auVar68._12_4_;
            fVar65 = (float)(-(uint)(1e-18 <= ABS(fVar95)) &
                            (uint)((fVar81 - fVar95 * fVar65) * fVar65 + fVar65));
            fVar148 = (float)(-(uint)(1e-18 <= ABS(fVar100)) &
                             (uint)((fVar82 - fVar100 * fVar148) * fVar148 + fVar148));
            fVar150 = (float)(-(uint)(1e-18 <= ABS(fVar101)) &
                             (uint)((fVar50 - fVar101 * fVar150) * fVar150 + fVar150));
            fVar63 = (float)(-(uint)(1e-18 <= ABS(fVar102)) &
                            (uint)((fVar83 - fVar102 * fVar63) * fVar63 + fVar63));
            auVar98._0_4_ = local_838 * fVar65;
            auVar98._4_4_ = fStack_834 * fVar148;
            auVar98._8_4_ = fStack_830 * fVar150;
            auVar98._12_4_ = fStack_82c * fVar63;
            auVar68 = minps(auVar98,_DAT_01f46a60);
            auVar146._0_4_ = fVar65 * local_848;
            auVar146._4_4_ = fVar148 * fStack_844;
            auVar146._8_4_ = fVar150 * fStack_840;
            auVar146._12_4_ = fVar63 * fStack_83c;
            auVar86 = minps(auVar146,_DAT_01f46a60);
            auVar72._0_4_ = fVar81 - auVar68._0_4_;
            auVar72._4_4_ = fVar82 - auVar68._4_4_;
            auVar72._8_4_ = fVar50 - auVar68._8_4_;
            auVar72._12_4_ = fVar83 - auVar68._12_4_;
            auVar90._0_4_ = fVar81 - auVar86._0_4_;
            auVar90._4_4_ = fVar82 - auVar86._4_4_;
            auVar90._8_4_ = fVar50 - auVar86._8_4_;
            auVar90._12_4_ = fVar83 - auVar86._12_4_;
            local_a78 = blendvps(auVar68,auVar72,local_7e8);
            local_a68 = blendvps(auVar86,auVar90,local_7e8);
            uVar43 = (ulong)(byte)uVar38;
            do {
              pfVar13 = (float *)0x0;
              if (uVar43 != 0) {
                for (; (uVar43 >> (long)pfVar13 & 1) == 0; pfVar13 = (float *)((long)pfVar13 + 1)) {
                }
              }
              local_9a8 = puVar46[(long)pfVar13];
              pGVar21 = (pSVar44->geometries).items[local_9a8].ptr;
              pfVar40 = (float *)(ulong)*(uint *)(ray + k * 4 + 0x90);
              if ((pGVar21->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar21->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_0071a2e3;
                local_9d8 = *(undefined4 *)(local_a78 + (long)pfVar13 * 4);
                uVar14 = *(undefined4 *)(local_a68 + (long)pfVar13 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_a58 + (long)pfVar13 * 4)
                ;
                args.context = context->user;
                local_9b8 = *(undefined4 *)(local_c08 + 0x50 + (long)pfVar13 * 4);
                local_9c8._4_4_ = uVar14;
                local_9c8._0_4_ = uVar14;
                local_9c8._8_4_ = uVar14;
                local_9c8._12_4_ = uVar14;
                uVar14 = *(undefined4 *)(local_a48 + (long)pfVar13 * 4);
                local_9f8._4_4_ = *(undefined4 *)(local_a38 + (long)pfVar13 * 4);
                local_9e8 = *(undefined4 *)(local_a28 + (long)pfVar13 * 4);
                local_a08[0] = (RTCHitN)(char)uVar14;
                local_a08[1] = (RTCHitN)(char)((uint)uVar14 >> 8);
                local_a08[2] = (RTCHitN)(char)((uint)uVar14 >> 0x10);
                local_a08[3] = (RTCHitN)(char)((uint)uVar14 >> 0x18);
                local_a08[4] = (RTCHitN)(char)uVar14;
                local_a08[5] = (RTCHitN)(char)((uint)uVar14 >> 8);
                local_a08[6] = (RTCHitN)(char)((uint)uVar14 >> 0x10);
                local_a08[7] = (RTCHitN)(char)((uint)uVar14 >> 0x18);
                local_a08[8] = (RTCHitN)(char)uVar14;
                local_a08[9] = (RTCHitN)(char)((uint)uVar14 >> 8);
                local_a08[10] = (RTCHitN)(char)((uint)uVar14 >> 0x10);
                local_a08[0xb] = (RTCHitN)(char)((uint)uVar14 >> 0x18);
                local_a08[0xc] = (RTCHitN)(char)uVar14;
                local_a08[0xd] = (RTCHitN)(char)((uint)uVar14 >> 8);
                local_a08[0xe] = (RTCHitN)(char)((uint)uVar14 >> 0x10);
                local_a08[0xf] = (RTCHitN)(char)((uint)uVar14 >> 0x18);
                local_9f8._0_4_ = local_9f8._4_4_;
                local_9f8._8_4_ = local_9f8._4_4_;
                local_9f8._12_4_ = local_9f8._4_4_;
                uStack_9e4 = local_9e8;
                uStack_9e0 = local_9e8;
                uStack_9dc = local_9e8;
                uStack_9d4 = local_9d8;
                uStack_9d0 = local_9d8;
                uStack_9cc = local_9d8;
                uStack_9b4 = local_9b8;
                uStack_9b0 = local_9b8;
                uStack_9ac = local_9b8;
                uStack_9a4 = local_9a8;
                uStack_9a0 = local_9a8;
                uStack_99c = local_9a8;
                local_998 = (args.context)->instID[0];
                uStack_994 = local_998;
                uStack_990 = local_998;
                uStack_98c = local_998;
                local_988 = (args.context)->instPrimID[0];
                uStack_984 = local_988;
                uStack_980 = local_988;
                uStack_97c = local_988;
                local_c48 = *local_c00;
                args.valid = (int *)local_c48;
                args.geometryUserPtr = pGVar21->userPtr;
                args.hit = local_a08;
                args.N = 4;
                args.ray = (RTCRayN *)ray;
                if (pGVar21->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar21->occlusionFilterN)(&args);
                  pSVar44 = scene;
                }
                if (local_c48 == (undefined1  [16])0x0) {
                  auVar73._8_4_ = 0xffffffff;
                  auVar73._0_8_ = 0xffffffffffffffff;
                  auVar73._12_4_ = 0xffffffff;
                  auVar73 = auVar73 ^ _DAT_01f46b70;
                }
                else {
                  p_Var22 = context->args->filter;
                  if ((p_Var22 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar21->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var22)(&args);
                    pSVar44 = scene;
                  }
                  auVar57._0_4_ = -(uint)(local_c48._0_4_ == 0);
                  auVar57._4_4_ = -(uint)(local_c48._4_4_ == 0);
                  auVar57._8_4_ = -(uint)(local_c48._8_4_ == 0);
                  auVar57._12_4_ = -(uint)(local_c48._12_4_ == 0);
                  auVar73 = auVar57 ^ _DAT_01f46b70;
                  auVar68 = blendvps(_DAT_01f45a40,*(undefined1 (*) [16])(args.ray + 0x80),auVar57);
                  *(undefined1 (*) [16])(args.ray + 0x80) = auVar68;
                }
                if ((_DAT_01f46b40 & auVar73) != (undefined1  [16])0x0) goto LAB_0071a2e3;
                *(float *)(ray + k * 4 + 0x80) = local_c28;
                pfVar40 = pfVar13;
              }
              uVar43 = uVar43 ^ 1L << ((ulong)pfVar13 & 0x3f);
            } while (uVar43 != 0);
            fStack_aec = *(float *)(ray + k * 4 + 0x10);
            fStack_afc = *(float *)(ray + k * 4 + 0x20);
            fVar150 = *(float *)(ray + k * 4 + 0x40);
            fVar148 = *(float *)(ray + k * 4 + 0x50);
            fStack_ca4 = *(float *)(ray + k * 4 + 0x60);
            local_c88 = (float)local_8a8 - fStack_afc;
            fStack_c84 = local_8a8._4_4_ - fStack_afc;
            fStack_c80 = fStack_8a0 - fStack_afc;
            fStack_c7c = fStack_89c - fStack_afc;
            local_b48 = local_8b8 - fStack_aec;
            fStack_b44 = fStack_8b4 - fStack_aec;
            fStack_b40 = fStack_8b0 - fStack_aec;
            fStack_b3c = fStack_8ac - fStack_aec;
            local_b38 = (float)local_898 - fStack_afc;
            fStack_b34 = local_898._4_4_ - fStack_afc;
            fStack_b30 = fStack_890 - fStack_afc;
            fStack_b2c = fStack_88c - fStack_afc;
            local_b28 = (local_8c8 - fStack_aec) + local_b48;
            fStack_b24 = (fStack_8c4 - fStack_aec) + fStack_b44;
            fStack_b20 = (fStack_8c0 - fStack_aec) + fStack_b40;
            fStack_b1c = (fStack_8bc - fStack_aec) + fStack_b3c;
            local_b18 = local_c88 + local_b38;
            fStack_b14 = fStack_c84 + fStack_b34;
            fStack_b10 = fStack_c80 + fStack_b30;
            fStack_b0c = fStack_c7c + fStack_b2c;
            fStack_c54 = fStack_8c4 - fStack_aec;
            local_c58 = local_8c8 - fStack_aec;
            fStack_c50 = fStack_8c0 - fStack_aec;
            fStack_c4c = fStack_8bc - fStack_aec;
          }
        }
      }
      fVar147 = auVar51._8_4_ - fStack_afc;
      fVar149 = (float)uStack_870 - fStack_afc;
      fVar151 = (float)uStack_880 - fStack_afc;
      fStack_afc = (float)uStack_c10 - fStack_afc;
      fVar161 = auVar51._4_4_ - fStack_aec;
      fVar125 = local_878._4_4_ - fStack_aec;
      fVar129 = local_888._4_4_ - fStack_aec;
      fStack_aec = local_c18._4_4_ - fStack_aec;
      fVar65 = *(float *)(ray + k * 4);
      fVar152 = auVar51._0_4_ - fVar65;
      fVar153 = (float)local_878 - fVar65;
      fVar156 = (float)local_888 - fVar65;
      fVar157 = (float)local_c18 - fVar65;
      fVar81 = (float)local_868 - fVar65;
      fVar95 = local_868._4_4_ - fVar65;
      fVar102 = fStack_860 - fVar65;
      fVar145 = fStack_85c - fVar65;
      fVar158 = local_858 - fVar65;
      fVar159 = fStack_854 - fVar65;
      fVar160 = fStack_850 - fVar65;
      fVar65 = fStack_84c - fVar65;
      local_c28 = fVar158 - fVar152;
      fStack_c24 = fVar159 - fVar153;
      fStack_c20 = fVar160 - fVar156;
      fStack_c1c = fVar65 - fVar157;
      fVar103 = local_b48 - fVar161;
      fVar107 = fStack_b44 - fVar125;
      fVar109 = fStack_b40 - fVar129;
      fVar113 = fStack_b3c - fStack_aec;
      fVar119 = local_b38 - fVar147;
      fVar128 = fStack_b34 - fVar149;
      fVar135 = fStack_b30 - fVar151;
      fVar141 = fStack_b2c - fStack_afc;
      fVar50 = local_c58 - local_b48;
      fVar64 = fStack_c54 - fStack_b44;
      fVar82 = fStack_c50 - fStack_b40;
      fVar100 = fStack_c4c - fStack_b3c;
      local_c18 = CONCAT44(fVar64,fVar50);
      uStack_c10 = CONCAT44(fVar100,fVar82);
      fVar63 = local_c88 - local_b38;
      fVar66 = fStack_c84 - fStack_b34;
      fVar83 = fStack_c80 - fStack_b30;
      fVar101 = fStack_c7c - fStack_b2c;
      fVar115 = fVar152 - fVar81;
      fVar116 = fVar153 - fVar95;
      fVar117 = fVar156 - fVar102;
      fVar118 = fVar157 - fVar145;
      fVar136 = (fVar103 * (local_b38 + fVar147) - (local_b48 + fVar161) * fVar119) * fVar150 +
                ((fVar158 + fVar152) * fVar119 - (local_b38 + fVar147) * local_c28) * fVar148 +
                (local_c28 * (local_b48 + fVar161) - (fVar158 + fVar152) * fVar103) * fStack_ca4;
      fVar140 = (fVar107 * (fStack_b34 + fVar149) - (fStack_b44 + fVar125) * fVar128) * fVar150 +
                ((fVar159 + fVar153) * fVar128 - (fStack_b34 + fVar149) * fStack_c24) * fVar148 +
                (fStack_c24 * (fStack_b44 + fVar125) - (fVar159 + fVar153) * fVar107) * fStack_ca4;
      fVar142 = (fVar109 * (fStack_b30 + fVar151) - (fStack_b40 + fVar129) * fVar135) * fVar150 +
                ((fVar160 + fVar156) * fVar135 - (fStack_b30 + fVar151) * fStack_c20) * fVar148 +
                (fStack_c20 * (fStack_b40 + fVar129) - (fVar160 + fVar156) * fVar109) * fStack_ca4;
      fVar144 = (fVar113 * (fStack_b2c + fStack_afc) - (fStack_b3c + fStack_aec) * fVar141) *
                fVar150 + ((fVar65 + fVar157) * fVar141 - (fStack_b2c + fStack_afc) * fStack_c1c) *
                          fVar148 + (fStack_c1c * (fStack_b3c + fStack_aec) -
                                    (fVar65 + fVar157) * fVar113) * fStack_ca4;
      fVar124 = fVar161 - local_c58;
      fVar132 = fVar125 - fStack_c54;
      fVar139 = fVar129 - fStack_c50;
      fVar143 = fStack_aec - fStack_c4c;
      fVar106 = fVar147 - local_c88;
      fVar108 = fVar149 - fStack_c84;
      fVar110 = fVar151 - fStack_c80;
      fVar114 = fStack_afc - fStack_c7c;
      fVar120 = (fVar124 * (local_c88 + fVar147) - (local_c58 + fVar161) * fVar106) * fVar150 +
                ((fVar152 + fVar81) * fVar106 - (local_c88 + fVar147) * fVar115) * fVar148 +
                (fVar115 * (local_c58 + fVar161) - (fVar152 + fVar81) * fVar124) * fStack_ca4;
      fVar126 = (fVar132 * (fStack_c84 + fVar149) - (fStack_c54 + fVar125) * fVar108) * fVar150 +
                ((fVar153 + fVar95) * fVar108 - (fStack_c84 + fVar149) * fVar116) * fVar148 +
                (fVar116 * (fStack_c54 + fVar125) - (fVar153 + fVar95) * fVar132) * fStack_ca4;
      fVar130 = (fVar139 * (fStack_c80 + fVar151) - (fStack_c50 + fVar129) * fVar110) * fVar150 +
                ((fVar156 + fVar102) * fVar110 - (fStack_c80 + fVar151) * fVar117) * fVar148 +
                (fVar117 * (fStack_c50 + fVar129) - (fVar156 + fVar102) * fVar139) * fStack_ca4;
      fVar133 = (fVar143 * (fStack_c7c + fStack_afc) - (fStack_c4c + fStack_aec) * fVar114) *
                fVar150 + ((fVar157 + fVar145) * fVar114 - (fStack_c7c + fStack_afc) * fVar118) *
                          fVar148 + (fVar118 * (fStack_c4c + fStack_aec) -
                                    (fVar157 + fVar145) * fVar143) * fStack_ca4;
      fVar121 = fVar81 - fVar158;
      fVar127 = fVar95 - fVar159;
      fVar131 = fVar102 - fVar160;
      fVar134 = fVar145 - fVar65;
      auVar58._0_4_ =
           (fVar50 * local_b18 - local_b28 * fVar63) * fVar150 +
           ((fVar158 + fVar81) * fVar63 - local_b18 * fVar121) * fVar148 +
           (fVar121 * local_b28 - (fVar158 + fVar81) * fVar50) * fStack_ca4;
      auVar58._4_4_ =
           (fVar64 * fStack_b14 - fStack_b24 * fVar66) * fVar150 +
           ((fVar159 + fVar95) * fVar66 - fStack_b14 * fVar127) * fVar148 +
           (fVar127 * fStack_b24 - (fVar159 + fVar95) * fVar64) * fStack_ca4;
      auVar58._8_4_ =
           (fVar82 * fStack_b10 - fStack_b20 * fVar83) * fVar150 +
           ((fVar160 + fVar102) * fVar83 - fStack_b10 * fVar131) * fVar148 +
           (fVar131 * fStack_b20 - (fVar160 + fVar102) * fVar82) * fStack_ca4;
      auVar58._12_4_ =
           (fVar100 * fStack_b0c - fStack_b1c * fVar101) * fVar150 +
           ((fVar65 + fVar145) * fVar101 - fStack_b0c * fVar134) * fVar148 +
           (fVar134 * fStack_b1c - (fVar65 + fVar145) * fVar100) * fStack_ca4;
      fVar145 = fVar136 + fVar120 + auVar58._0_4_;
      fVar158 = fVar140 + fVar126 + auVar58._4_4_;
      fVar159 = fVar142 + fVar130 + auVar58._8_4_;
      fVar160 = fVar144 + fVar133 + auVar58._12_4_;
      auVar74._8_4_ = fVar142;
      auVar74._0_8_ = CONCAT44(fVar140,fVar136);
      auVar74._12_4_ = fVar144;
      auVar28._8_4_ = fVar130;
      auVar28._0_8_ = CONCAT44(fVar126,fVar120);
      auVar28._12_4_ = fVar133;
      auVar51 = minps(auVar74,auVar28);
      auVar51 = minps(auVar51,auVar58);
      auVar93._8_4_ = fVar142;
      auVar93._0_8_ = CONCAT44(fVar140,fVar136);
      auVar93._12_4_ = fVar144;
      auVar29._8_4_ = fVar130;
      auVar29._0_8_ = CONCAT44(fVar126,fVar120);
      auVar29._12_4_ = fVar133;
      auVar68 = maxps(auVar93,auVar29);
      auVar68 = maxps(auVar68,auVar58);
      fVar65 = ABS(fVar145) * 1.1920929e-07;
      fVar81 = ABS(fVar158) * 1.1920929e-07;
      fVar95 = ABS(fVar159) * 1.1920929e-07;
      fVar102 = ABS(fVar160) * 1.1920929e-07;
      auVar94._4_4_ = -(uint)(auVar68._4_4_ <= fVar81);
      auVar94._0_4_ = -(uint)(auVar68._0_4_ <= fVar65);
      auVar94._8_4_ = -(uint)(auVar68._8_4_ <= fVar95);
      auVar94._12_4_ = -(uint)(auVar68._12_4_ <= fVar102);
      auVar75._4_4_ = -(uint)(-fVar81 <= auVar51._4_4_);
      auVar75._0_4_ = -(uint)(-fVar65 <= auVar51._0_4_);
      auVar75._8_4_ = -(uint)(-fVar95 <= auVar51._8_4_);
      auVar75._12_4_ = -(uint)(-fVar102 <= auVar51._12_4_);
      auVar94 = auVar94 | auVar75;
      iVar47 = movmskps((int)pfVar40,auVar94);
      if (iVar47 != 0) {
        auVar138._0_4_ = fVar103 * fVar106 - fVar124 * fVar119;
        auVar138._4_4_ = fVar107 * fVar108 - fVar132 * fVar128;
        auVar138._8_4_ = fVar109 * fVar110 - fVar139 * fVar135;
        auVar138._12_4_ = fVar113 * fVar114 - fVar143 * fVar141;
        auVar105._0_4_ = fVar124 * fVar63 - fVar50 * fVar106;
        auVar105._4_4_ = fVar132 * fVar66 - fVar64 * fVar108;
        auVar105._8_4_ = fVar139 * fVar83 - fVar82 * fVar110;
        auVar105._12_4_ = fVar143 * fVar101 - fVar100 * fVar114;
        auVar59._4_4_ = -(uint)(ABS(fVar132 * fVar128) < ABS(fVar64 * fVar108));
        auVar59._0_4_ = -(uint)(ABS(fVar124 * fVar119) < ABS(fVar50 * fVar106));
        auVar59._8_4_ = -(uint)(ABS(fVar139 * fVar135) < ABS(fVar82 * fVar110));
        auVar59._12_4_ = -(uint)(ABS(fVar143 * fVar141) < ABS(fVar100 * fVar114));
        local_a48 = blendvps(auVar105,auVar138,auVar59);
        auVar123._0_4_ = fVar121 * fVar106 - fVar115 * fVar63;
        auVar123._4_4_ = fVar127 * fVar108 - fVar116 * fVar66;
        auVar123._8_4_ = fVar131 * fVar110 - fVar117 * fVar83;
        auVar123._12_4_ = fVar134 * fVar114 - fVar118 * fVar101;
        auVar60._4_4_ = -(uint)(ABS(fStack_c24 * fVar108) < ABS(fVar116 * fVar66));
        auVar60._0_4_ = -(uint)(ABS(local_c28 * fVar106) < ABS(fVar115 * fVar63));
        auVar60._8_4_ = -(uint)(ABS(fStack_c20 * fVar110) < ABS(fVar117 * fVar83));
        auVar60._12_4_ = -(uint)(ABS(fStack_c1c * fVar114) < ABS(fVar118 * fVar101));
        auVar30._4_4_ = fVar128 * fVar116 - fStack_c24 * fVar108;
        auVar30._0_4_ = fVar119 * fVar115 - local_c28 * fVar106;
        auVar30._8_4_ = fVar135 * fVar117 - fStack_c20 * fVar110;
        auVar30._12_4_ = fVar141 * fVar118 - fStack_c1c * fVar114;
        local_a38 = blendvps(auVar123,auVar30,auVar60);
        auVar99._0_4_ = fVar115 * fVar50 - fVar121 * fVar124;
        auVar99._4_4_ = fVar116 * fVar64 - fVar127 * fVar132;
        auVar99._8_4_ = fVar117 * fVar82 - fVar131 * fVar139;
        auVar99._12_4_ = fVar118 * fVar100 - fVar134 * fVar143;
        auVar61._4_4_ = -(uint)(ABS(fVar116 * fVar107) < ABS(fVar127 * fVar132));
        auVar61._0_4_ = -(uint)(ABS(fVar115 * fVar103) < ABS(fVar121 * fVar124));
        fVar64 = (float)DAT_01f46a60;
        fVar66 = DAT_01f46a60._4_4_;
        fVar81 = DAT_01f46a60._12_4_;
        auVar61._8_4_ = -(uint)(ABS(fVar117 * fVar109) < ABS(fVar131 * fVar139));
        auVar61._12_4_ = -(uint)(ABS(fVar118 * fVar113) < ABS(fVar134 * fVar143));
        auVar31._4_4_ = fStack_c24 * fVar132 - fVar116 * fVar107;
        auVar31._0_4_ = local_c28 * fVar124 - fVar115 * fVar103;
        auVar31._8_4_ = fStack_c20 * fVar139 - fVar117 * fVar109;
        auVar31._12_4_ = fStack_c1c * fVar143 - fVar118 * fVar113;
        local_a28 = blendvps(auVar99,auVar31,auVar61);
        fVar65 = fVar150 * local_a48._0_4_ +
                 fVar148 * local_a38._0_4_ + fStack_ca4 * local_a28._0_4_;
        fVar50 = fVar150 * local_a48._4_4_ +
                 fVar148 * local_a38._4_4_ + fStack_ca4 * local_a28._4_4_;
        fVar63 = fVar150 * local_a48._8_4_ +
                 fVar148 * local_a38._8_4_ + fStack_ca4 * local_a28._8_4_;
        fVar148 = fVar150 * local_a48._12_4_ +
                  fVar148 * local_a38._12_4_ + fStack_ca4 * local_a28._12_4_;
        auVar111._0_4_ = fVar65 + fVar65;
        auVar111._4_4_ = fVar50 + fVar50;
        auVar111._8_4_ = fVar63 + fVar63;
        auVar111._12_4_ = fVar148 + fVar148;
        auVar76._0_4_ = fVar147 * local_a28._0_4_;
        auVar76._4_4_ = fVar149 * local_a28._4_4_;
        auVar76._8_4_ = fVar151 * local_a28._8_4_;
        auVar76._12_4_ = fStack_afc * local_a28._12_4_;
        fVar82 = fVar152 * local_a48._0_4_ + fVar161 * local_a38._0_4_ + auVar76._0_4_;
        fVar83 = fVar153 * local_a48._4_4_ + fVar125 * local_a38._4_4_ + auVar76._4_4_;
        fVar95 = fVar156 * local_a48._8_4_ + fVar129 * local_a38._8_4_ + auVar76._8_4_;
        fVar100 = fVar157 * local_a48._12_4_ + fStack_aec * local_a38._12_4_ + auVar76._12_4_;
        auVar51 = rcpps(auVar76,auVar111);
        fVar65 = auVar51._0_4_;
        fVar148 = auVar51._4_4_;
        fVar50 = auVar51._8_4_;
        fVar63 = auVar51._12_4_;
        fVar150 = DAT_01f46a60._8_4_;
        local_a58._0_4_ = ((fVar64 - auVar111._0_4_ * fVar65) * fVar65 + fVar65) * (fVar82 + fVar82)
        ;
        local_a58._4_4_ =
             ((fVar66 - auVar111._4_4_ * fVar148) * fVar148 + fVar148) * (fVar83 + fVar83);
        fStack_a50 = ((fVar150 - auVar111._8_4_ * fVar50) * fVar50 + fVar50) * (fVar95 + fVar95);
        fStack_a4c = ((fVar81 - auVar111._12_4_ * fVar63) * fVar63 + fVar63) * (fVar100 + fVar100);
        fVar65 = *(float *)(ray + k * 4 + 0x80);
        fVar148 = *(float *)(ray + k * 4 + 0x30);
        auVar91._4_4_ = -(uint)(fVar148 <= (float)local_a58._4_4_);
        auVar91._0_4_ = -(uint)(fVar148 <= (float)local_a58._0_4_);
        auVar91._8_4_ = -(uint)(fVar148 <= fStack_a50);
        auVar91._12_4_ = -(uint)(fVar148 <= fStack_a4c);
        auVar77._0_4_ =
             -(uint)((float)local_a58._0_4_ <= fVar65 && fVar148 <= (float)local_a58._0_4_) &
             auVar94._0_4_;
        auVar77._4_4_ =
             -(uint)((float)local_a58._4_4_ <= fVar65 && fVar148 <= (float)local_a58._4_4_) &
             auVar94._4_4_;
        auVar77._8_4_ = -(uint)(fStack_a50 <= fVar65 && fVar148 <= fStack_a50) & auVar94._8_4_;
        auVar77._12_4_ = -(uint)(fStack_a4c <= fVar65 && fVar148 <= fStack_a4c) & auVar94._12_4_;
        iVar47 = movmskps(iVar47,auVar77);
        if ((iVar47 != 0) &&
           (auVar78._0_4_ = auVar77._0_4_ & -(uint)(auVar111._0_4_ != 0.0),
           auVar78._4_4_ = auVar77._4_4_ & -(uint)(auVar111._4_4_ != 0.0),
           auVar78._8_4_ = auVar77._8_4_ & -(uint)(auVar111._8_4_ != 0.0),
           auVar78._12_4_ = auVar77._12_4_ & -(uint)(auVar111._12_4_ != 0.0),
           uVar38 = movmskps(iVar47,auVar78), uVar38 != 0)) {
          auVar33._4_4_ = fVar158;
          auVar33._0_4_ = fVar145;
          auVar33._8_4_ = fVar159;
          auVar33._12_4_ = fVar160;
          local_a18._4_4_ = uVar35;
          local_a18._0_4_ = uVar34;
          local_a18._8_4_ = uVar36;
          local_a18._12_4_ = uVar37;
          pSVar44 = context->scene;
          auVar51 = rcpps(auVar91,auVar33);
          fVar148 = auVar51._0_4_;
          fVar50 = auVar51._4_4_;
          fVar63 = auVar51._8_4_;
          fVar82 = auVar51._12_4_;
          fVar148 = (float)(-(uint)(1e-18 <= ABS(fVar145)) &
                           (uint)((fVar64 - fVar145 * fVar148) * fVar148 + fVar148));
          fVar50 = (float)(-(uint)(1e-18 <= ABS(fVar158)) &
                          (uint)((fVar66 - fVar158 * fVar50) * fVar50 + fVar50));
          fVar63 = (float)(-(uint)(1e-18 <= ABS(fVar159)) &
                          (uint)((fVar150 - fVar159 * fVar63) * fVar63 + fVar63));
          fVar82 = (float)(-(uint)(1e-18 <= ABS(fVar160)) &
                          (uint)((fVar81 - fVar160 * fVar82) * fVar82 + fVar82));
          auVar112._0_4_ = fVar136 * fVar148;
          auVar112._4_4_ = fVar140 * fVar50;
          auVar112._8_4_ = fVar142 * fVar63;
          auVar112._12_4_ = fVar144 * fVar82;
          auVar51 = minps(auVar112,_DAT_01f46a60);
          auVar155._0_4_ = fVar148 * fVar120;
          auVar155._4_4_ = fVar50 * fVar126;
          auVar155._8_4_ = fVar63 * fVar130;
          auVar155._12_4_ = fVar82 * fVar133;
          auVar68 = minps(auVar155,_DAT_01f46a60);
          auVar79._0_4_ = fVar64 - auVar51._0_4_;
          auVar79._4_4_ = fVar66 - auVar51._4_4_;
          auVar79._8_4_ = fVar150 - auVar51._8_4_;
          auVar79._12_4_ = fVar81 - auVar51._12_4_;
          auVar92._0_4_ = fVar64 - auVar68._0_4_;
          auVar92._4_4_ = fVar66 - auVar68._4_4_;
          auVar92._8_4_ = fVar150 - auVar68._8_4_;
          auVar92._12_4_ = fVar81 - auVar68._12_4_;
          local_a78 = blendvps(auVar51,auVar79,local_a18);
          local_a68 = blendvps(auVar68,auVar92,local_a18);
          uVar43 = (ulong)(uVar38 & 0xff);
          do {
            uVar23 = 0;
            if (uVar43 != 0) {
              for (; (uVar43 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
              }
            }
            local_9a8 = puVar46[uVar23];
            pGVar21 = (pSVar44->geometries).items[local_9a8].ptr;
            if ((pGVar21->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar21->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_0071a2e3;
              local_9d8 = *(undefined4 *)(local_a78 + uVar23 * 4);
              uVar14 = *(undefined4 *)(local_a68 + uVar23 * 4);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_a58 + uVar23 * 4);
              args.context = context->user;
              local_9b8 = *(undefined4 *)(local_c08 + 0x50 + uVar23 * 4);
              local_9c8._4_4_ = uVar14;
              local_9c8._0_4_ = uVar14;
              local_9c8._8_4_ = uVar14;
              local_9c8._12_4_ = uVar14;
              uVar14 = *(undefined4 *)(local_a48 + uVar23 * 4);
              uVar15 = *(undefined4 *)(local_a38 + uVar23 * 4);
              local_9e8 = *(undefined4 *)(local_a28 + uVar23 * 4);
              local_9f8._4_4_ = uVar15;
              local_9f8._0_4_ = uVar15;
              local_9f8._8_4_ = uVar15;
              local_9f8._12_4_ = uVar15;
              local_a08[0] = (RTCHitN)(char)uVar14;
              local_a08[1] = (RTCHitN)(char)((uint)uVar14 >> 8);
              local_a08[2] = (RTCHitN)(char)((uint)uVar14 >> 0x10);
              local_a08[3] = (RTCHitN)(char)((uint)uVar14 >> 0x18);
              local_a08[4] = (RTCHitN)(char)uVar14;
              local_a08[5] = (RTCHitN)(char)((uint)uVar14 >> 8);
              local_a08[6] = (RTCHitN)(char)((uint)uVar14 >> 0x10);
              local_a08[7] = (RTCHitN)(char)((uint)uVar14 >> 0x18);
              local_a08[8] = (RTCHitN)(char)uVar14;
              local_a08[9] = (RTCHitN)(char)((uint)uVar14 >> 8);
              local_a08[10] = (RTCHitN)(char)((uint)uVar14 >> 0x10);
              local_a08[0xb] = (RTCHitN)(char)((uint)uVar14 >> 0x18);
              local_a08[0xc] = (RTCHitN)(char)uVar14;
              local_a08[0xd] = (RTCHitN)(char)((uint)uVar14 >> 8);
              local_a08[0xe] = (RTCHitN)(char)((uint)uVar14 >> 0x10);
              local_a08[0xf] = (RTCHitN)(char)((uint)uVar14 >> 0x18);
              uStack_9e4 = local_9e8;
              uStack_9e0 = local_9e8;
              uStack_9dc = local_9e8;
              uStack_9d4 = local_9d8;
              uStack_9d0 = local_9d8;
              uStack_9cc = local_9d8;
              uStack_9b4 = local_9b8;
              uStack_9b0 = local_9b8;
              uStack_9ac = local_9b8;
              uStack_9a4 = local_9a8;
              uStack_9a0 = local_9a8;
              uStack_99c = local_9a8;
              local_998 = (args.context)->instID[0];
              uStack_994 = local_998;
              uStack_990 = local_998;
              uStack_98c = local_998;
              local_988 = (args.context)->instPrimID[0];
              uStack_984 = local_988;
              uStack_980 = local_988;
              uStack_97c = local_988;
              local_c48 = *local_c00;
              args.valid = (int *)local_c48;
              args.geometryUserPtr = pGVar21->userPtr;
              args.hit = local_a08;
              args.N = 4;
              args.ray = (RTCRayN *)ray;
              if (pGVar21->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar21->occlusionFilterN)(&args);
              }
              if (local_c48 == (undefined1  [16])0x0) {
                auVar80._8_4_ = 0xffffffff;
                auVar80._0_8_ = 0xffffffffffffffff;
                auVar80._12_4_ = 0xffffffff;
                auVar80 = auVar80 ^ _DAT_01f46b70;
              }
              else {
                p_Var22 = context->args->filter;
                if ((p_Var22 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar21->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var22)(&args);
                }
                auVar62._0_4_ = -(uint)(local_c48._0_4_ == 0);
                auVar62._4_4_ = -(uint)(local_c48._4_4_ == 0);
                auVar62._8_4_ = -(uint)(local_c48._8_4_ == 0);
                auVar62._12_4_ = -(uint)(local_c48._12_4_ == 0);
                auVar80 = auVar62 ^ _DAT_01f46b70;
                auVar51 = blendvps(_DAT_01f45a40,*(undefined1 (*) [16])(args.ray + 0x80),auVar62);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar51;
              }
              if ((_DAT_01f46b40 & auVar80) != (undefined1  [16])0x0) goto LAB_0071a2e3;
              *(float *)(ray + k * 4 + 0x80) = fVar65;
            }
            uVar43 = uVar43 ^ 1L << (uVar23 & 0x3f);
          } while (uVar43 != 0);
        }
      }
    }
  } while( true );
LAB_0071a2e3:
  *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
  goto LAB_0071a2ef;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }